

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::RenderMarkerPlus
               (ImDrawList *DrawList,ImVec2 *c,float s,bool param_4,ImU32 col_outline,bool param_6,
               ImU32 param_7,float weight)

{
  float fVar1;
  float fVar2;
  int i;
  long lVar3;
  ImVec2 marker [4];
  ImVec2 local_48;
  ImVec2 IStack_40;
  ImVec2 local_38;
  ImVec2 aIStack_30 [2];
  
  local_48.x = 1.0;
  local_48.y = 0.0;
  IStack_40.x = 0.0;
  IStack_40.y = -1.0;
  local_38.x = -1.0;
  local_38.y = 0.0;
  aIStack_30[0].x = 0.0;
  aIStack_30[0].y = 1.0;
  fVar1 = c->x;
  fVar2 = c->y;
  lVar3 = 0;
  do {
    (&local_48)[lVar3].x = (&local_48)[lVar3].x * s + fVar1;
    (&local_48)[lVar3].y = (&local_48)[lVar3].y * s + fVar2;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  ImDrawList::AddLine(DrawList,&local_48,&local_38,col_outline,weight);
  ImDrawList::AddLine(DrawList,&IStack_40,aIStack_30,col_outline,weight);
  return;
}

Assistant:

inline void RenderMarkerPlus(ImDrawList& DrawList, const ImVec2& c, float s, bool /*outline*/, ImU32 col_outline, bool /*fill*/, ImU32 /*col_fill*/, float weight) {
    ImVec2 marker[4] = {ImVec2(1, 0), ImVec2(0, -1), ImVec2(-1, 0), ImVec2(0, 1)};
    TransformMarker(marker, 4, c, s);
    DrawList.AddLine(marker[0], marker[2], col_outline, weight);
    DrawList.AddLine(marker[1], marker[3], col_outline, weight);
}